

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  string *in_RSI;
  string *in_RDI;
  string search_path;
  int i;
  int searchPathAmount;
  string original_file;
  char original_file_buffer [4096];
  string *in_stack_ffffffffffffeda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedb0;
  string *in_stack_ffffffffffffedb8;
  undefined4 in_stack_ffffffffffffedc8;
  uint uVar7;
  undefined1 in_stack_ffffffffffffedcc;
  undefined1 in_stack_ffffffffffffedcd;
  undefined1 in_stack_ffffffffffffedce;
  undefined1 in_stack_ffffffffffffedcf;
  Dependency *in_stack_ffffffffffffedd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffedf0;
  undefined4 in_stack_ffffffffffffedf4;
  byte local_1202;
  string *in_stack_ffffffffffffee38;
  string local_1188 [39];
  byte local_1161;
  string local_1160 [32];
  string local_1140 [8];
  string *in_stack_ffffffffffffeec8;
  string local_1120 [36];
  int local_10fc;
  int local_10f8;
  byte local_10f1;
  string local_10f0 [36];
  int local_10cc;
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [48];
  string local_1038 [32];
  char local_1018 [4072];
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x107339);
  std::__cxx11::string::string(in_RDI + 0x58);
  std::__cxx11::string::string(local_1038);
  rtrim((string *)CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0));
  bVar1 = isRpath(in_stack_ffffffffffffedb0);
  if (bVar1) {
    searchFilenameInRpaths(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::operator=(local_1038,local_1068);
    std::__cxx11::string::~string(local_1068);
  }
  else {
    in_stack_ffffffffffffee38 =
         rtrim((string *)CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0));
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = realpath(pcVar4,local_1018);
    if (pcVar4 == (char *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING : Cannot resolve path \'");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar6 = std::operator<<(poVar6,pcVar4);
      poVar6 = std::operator<<(poVar6,"\'");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::operator=(local_1038,in_RSI);
    }
    else {
      std::__cxx11::string::operator=(local_1038,local_1018);
    }
  }
  bVar1 = std::operator!=(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  if (bVar1) {
    addSymlink(in_stack_ffffffffffffedd0,
               (string *)
               CONCAT17(in_stack_ffffffffffffedcf,
                        CONCAT16(in_stack_ffffffffffffedce,
                                 CONCAT15(in_stack_ffffffffffffedcd,
                                          CONCAT14(in_stack_ffffffffffffedcc,
                                                   in_stack_ffffffffffffedc8)))));
  }
  std::__cxx11::string::string(local_10a8,local_1038);
  stripPrefix(in_stack_ffffffffffffedb8);
  std::__cxx11::string::operator=(in_RDI,local_1088);
  std::__cxx11::string::~string(local_1088);
  std::__cxx11::string::~string(local_10a8);
  std::__cxx11::string::rfind((char *)local_1038,0x1438c2);
  std::__cxx11::string::substr((ulong)local_10c8,(ulong)local_1038);
  std::__cxx11::string::operator=(in_RDI + 0x20,local_10c8);
  std::__cxx11::string::~string(local_10c8);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 0x20));
    if (*pcVar4 != '/') {
      std::__cxx11::string::operator+=(in_RDI + 0x20,"/");
    }
  }
  bVar1 = Settings::isPrefixBundled(in_stack_ffffffffffffeda8);
  if (bVar1) {
    bVar2 = std::__cxx11::string::empty();
    local_10f1 = 0;
    local_1202 = 1;
    if ((bVar2 & 1) == 0) {
      std::operator+(in_stack_ffffffffffffedd8,&in_stack_ffffffffffffedd0->filename);
      local_10f1 = 1;
      bVar1 = fileExists(in_stack_ffffffffffffee38);
      local_1202 = bVar1 ^ 0xff;
    }
    if ((local_10f1 & 1) != 0) {
      std::__cxx11::string::~string(local_10f0);
    }
    if ((local_1202 & 1) != 0) {
      local_10f8 = Settings::searchPathAmount();
      if (local_10f8 == 0) {
        initSearchPaths();
        local_10f8 = Settings::searchPathAmount();
      }
      for (local_10fc = 0; local_10fc < local_10f8; local_10fc = local_10fc + 1) {
        Settings::searchPath_abi_cxx11_((int)((ulong)in_stack_ffffffffffffedb8 >> 0x20));
        std::operator+(in_stack_ffffffffffffedd8,&in_stack_ffffffffffffedd0->filename);
        bVar1 = fileExists(in_stack_ffffffffffffee38);
        uVar7 = (uint)bVar1 << 0x18;
        std::__cxx11::string::~string(local_1140);
        if ((uVar7 & 0x1000000) == 0) {
          local_10cc = 0;
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"FOUND ");
          poVar6 = std::operator<<(poVar6,in_RDI);
          in_stack_ffffffffffffedd8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<(poVar6," in ");
          in_stack_ffffffffffffedd0 =
               (Dependency *)std::operator<<((ostream *)in_stack_ffffffffffffedd8,local_1120);
          std::ostream::operator<<
                    ((ostream *)in_stack_ffffffffffffedd0,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::operator=(in_RDI + 0x20,local_1120);
          missing_prefixes = true;
          local_10cc = 2;
        }
        std::__cxx11::string::~string(local_1120);
        if (local_10cc != 0) break;
      }
    }
    local_1161 = 0;
    bVar1 = Settings::isPrefixIgnored(in_stack_ffffffffffffedb8);
    bVar2 = 0;
    if (!bVar1) {
      bVar3 = std::__cxx11::string::empty();
      bVar2 = 1;
      if ((bVar3 & 1) == 0) {
        std::operator+(in_stack_ffffffffffffedd8,&in_stack_ffffffffffffedd0->filename);
        local_1161 = 1;
        bVar1 = fileExists(in_stack_ffffffffffffee38);
        bVar2 = bVar1 ^ 0xff;
      }
    }
    uVar7 = (uint)bVar2 << 0x18;
    if ((local_1161 & 1) != 0) {
      std::__cxx11::string::~string(local_1160);
    }
    if ((uVar7 & 0x1000000) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING : Library ");
      poVar6 = std::operator<<(poVar6,in_RDI);
      poVar6 = std::operator<<(poVar6," has an incomplete name (location unknown)");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      missing_prefixes = true;
      getUserInputDirForFile(in_stack_ffffffffffffeec8);
      Settings::addSearchPath((string *)0x107a9e);
      std::__cxx11::string::~string(local_1188);
    }
    std::__cxx11::string::operator=(in_RDI + 0x58,in_RDI);
    local_10cc = 0;
  }
  else {
    local_10cc = 1;
  }
  std::__cxx11::string::~string(local_1038);
  return;
}

Assistant:

Dependency::Dependency(std::string path, const std::string& dependent_file)
{
    char original_file_buffer[PATH_MAX];
    std::string original_file;

    rtrim(path);
    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(rtrim(path).c_str(), original_file_buffer))
    {
        original_file = original_file_buffer;
    }
    else
    {
        std::cerr << "\n/!\\ WARNING : Cannot resolve path '" << path.c_str() << "'" << std::endl;
        original_file = path;
    }

    // check if given path is a symlink
    if (original_file != path) addSymlink(path);

    filename = stripPrefix(original_file);
    prefix = original_file.substr(0, original_file.rfind("/")+1);
    
    if( !prefix.empty() && prefix[ prefix.size()-1 ] != '/' ) prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix)) return;

    // check if the lib is in a known location
    if( prefix.empty() || !fileExists( prefix+filename ) )
    {
        //the paths contains at least /usr/lib so if it is empty we have not initialized it
        int searchPathAmount = Settings::searchPathAmount();
        if( searchPathAmount == 0 )
        {
            initSearchPaths();
            searchPathAmount = Settings::searchPathAmount();
        }
        
        //check if file is contained in one of the paths
        for( int i=0; i<searchPathAmount; ++i)
        {
            std::string search_path = Settings::searchPath(i);
            if (fileExists( search_path+filename ))
            {
                std::cout << "FOUND " << filename << " in " << search_path << std::endl;
                prefix = search_path;
                missing_prefixes = true; //the prefix was missing
                break;
            }
        }
    }
    
    //If the location is still unknown, ask the user for search path
    if( !Settings::isPrefixIgnored(prefix)
        && ( prefix.empty() || !fileExists( prefix+filename ) ) )
    {
        std::cerr << "\n/!\\ WARNING : Library " << filename << " has an incomplete name (location unknown)" << std::endl;
        missing_prefixes = true;

        Settings::addSearchPath(getUserInputDirForFile(filename));
    }

    new_name = filename;
}